

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportFileGenerator.cxx
# Opt level: O2

bool __thiscall
cmExportFileGenerator::AddTargetNamespace
          (cmExportFileGenerator *this,string *input,cmGeneratorTarget *target,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *missingTargets)

{
  bool bVar1;
  iterator iVar2;
  string *this_00;
  cmGeneratorTarget *tgt;
  string namespacedTarget;
  TargetOrString resolved;
  cmGeneratorTarget *local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  string local_78;
  TargetOrString local_58;
  
  cmGeneratorTarget::ResolveTargetReference(&local_58,target,input);
  local_a0 = local_58.Target;
  if (local_58.Target != (cmGeneratorTarget *)0x0) {
    bVar1 = cmGeneratorTarget::IsImported(local_58.Target);
    if (!bVar1) {
      iVar2 = std::
              _Rb_tree<cmGeneratorTarget_*,_cmGeneratorTarget_*,_std::_Identity<cmGeneratorTarget_*>,_std::less<cmGeneratorTarget_*>,_std::allocator<cmGeneratorTarget_*>_>
              ::find(&(this->ExportedTargets)._M_t,&local_a0);
      if ((_Rb_tree_header *)iVar2._M_node ==
          &(this->ExportedTargets)._M_t._M_impl.super__Rb_tree_header) {
        local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
        local_98._M_string_length = 0;
        local_98.field_2._M_local_buf[0] = '\0';
        (*this->_vptr_cmExportFileGenerator[0xe])(this,&local_98,missingTargets,target,local_a0);
        if (local_98._M_string_length == 0) {
          cmGeneratorTarget::GetName_abi_cxx11_(local_a0);
        }
        std::__cxx11::string::_M_assign((string *)input);
        this_00 = &local_98;
      }
      else {
        cmGeneratorTarget::GetExportName_abi_cxx11_(&local_78,local_a0);
        std::operator+(&local_98,&this->Namespace,&local_78);
        std::__cxx11::string::operator=((string *)input,(string *)&local_98);
        std::__cxx11::string::~string((string *)&local_98);
        this_00 = &local_78;
      }
      std::__cxx11::string::~string((string *)this_00);
      goto LAB_0028236e;
    }
    cmGeneratorTarget::GetName_abi_cxx11_(local_58.Target);
  }
  std::__cxx11::string::_M_assign((string *)input);
LAB_0028236e:
  std::__cxx11::string::~string((string *)&local_58);
  return local_58.Target != (cmGeneratorTarget *)0x0;
}

Assistant:

bool cmExportFileGenerator::AddTargetNamespace(
  std::string& input, cmGeneratorTarget* target,
  std::vector<std::string>& missingTargets)
{
  cmGeneratorTarget::TargetOrString resolved =
    target->ResolveTargetReference(input);

  cmGeneratorTarget* tgt = resolved.Target;
  if (!tgt) {
    input = resolved.String;
    return false;
  }

  if (tgt->IsImported()) {
    input = tgt->GetName();
    return true;
  }
  if (this->ExportedTargets.find(tgt) != this->ExportedTargets.end()) {
    input = this->Namespace + tgt->GetExportName();
  } else {
    std::string namespacedTarget;
    this->HandleMissingTarget(namespacedTarget, missingTargets, target, tgt);
    if (!namespacedTarget.empty()) {
      input = namespacedTarget;
    } else {
      input = tgt->GetName();
    }
  }
  return true;
}